

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

uint32 __thiscall Func::GetInstrCount(Func *this)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  uint32 uVar6;
  Instr **ppIVar7;
  
  ppIVar7 = &this->m_headInstr;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  uVar6 = 0;
  pIVar5 = (Instr *)0x0;
  do {
    pIVar1 = *ppIVar7;
    if (pIVar1 == (Instr *)0x0) {
      return uVar6;
    }
    if ((pIVar5 != (Instr *)0x0) && (pIVar5->m_next != pIVar1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                         ,0x4a1,"(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)"
                         ,"Modifying instr list but not using EDITING iterator!");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    uVar6 = uVar6 + 1;
    ppIVar7 = &pIVar1->m_next;
    pIVar5 = pIVar1;
  } while( true );
}

Assistant:

uint32
Func::GetInstrCount()
{
    uint instrCount = 0;

    FOREACH_INSTR_IN_FUNC(instr, this)
    {
        instrCount++;
    }NEXT_INSTR_IN_FUNC;

    return instrCount;
}